

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O3

void __thiscall Rml::DecoratorTiled::Tile::CalculateDimensions(Tile *this,Texture texture)

{
  Vector2f VVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  Vector2i VVar5;
  Vector2f VVar6;
  undefined4 in_ECX;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  Texture local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_18 [16];
  
  local_38._8_8_ = texture._8_8_;
  local_38.render_manager = texture.render_manager;
  if (this->tile_data_calculated == false) {
    this->tile_data_calculated = true;
    (this->tile_data).size.x = 0.0;
    (this->tile_data).size.y = 0.0;
    (this->tile_data).texcoords[0].x = 0.0;
    (this->tile_data).texcoords[0].y = 0.0;
    (this->tile_data).texcoords[1].x = 0.0;
    (this->tile_data).texcoords[1].y = 0.0;
    VVar5 = Texture::GetDimensions(&local_38);
    iVar4 = VVar5.x;
    if ((ulong)VVar5 >> 0x20 != 0 && iVar4 != 0) {
      auVar10._4_4_ = -(uint)((this->position).y != 0.0);
      auVar10._0_4_ = -(uint)((this->position).x != 0.0);
      auVar10._8_4_ = -(uint)((this->size).x != 0.0);
      auVar10._12_4_ = -(uint)((this->size).y != 0.0);
      iVar7 = movmskps(CONCAT31((int3)((uint)in_ECX >> 8),iVar4 != 0),auVar10);
      fVar11 = (float)iVar4;
      fVar12 = (float)VVar5.y;
      if (iVar7 == 0) {
        VVar6.y = fVar12;
        VVar6.x = fVar11;
      }
      else {
        VVar6 = this->size;
      }
      auVar8._8_8_ = 0;
      auVar8._0_4_ = VVar6.x;
      auVar8._4_4_ = VVar6.y;
      (this->tile_data).size = VVar6;
      auVar2._4_4_ = fVar12;
      auVar2._0_4_ = fVar11;
      auVar2._8_8_ = 0;
      local_18 = divps(auVar8,auVar2);
      local_28 = CONCAT44(fVar12,fVar11);
      uStack_20 = 0;
      fVar11 = Math::Absolute(VVar6.x);
      fVar12 = Math::Absolute((this->tile_data).size.y);
      (this->tile_data).size.x = fVar11;
      (this->tile_data).size.y = fVar12;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = (this->position).x;
      auVar9._4_4_ = (this->position).y;
      auVar3._8_8_ = uStack_20;
      auVar3._0_8_ = local_28;
      auVar10 = divps(auVar9,auVar3);
      VVar1.y = (float)local_18._4_4_ + auVar10._4_4_;
      VVar1.x = (float)local_18._0_4_ + auVar10._0_4_;
      (this->tile_data).texcoords[0] = auVar10._0_8_;
      (this->tile_data).texcoords[1] = VVar1;
    }
    else {
      (this->tile_data).size.x = 0.0;
      (this->tile_data).size.y = 0.0;
      (this->tile_data).texcoords[0].x = 0.0;
      (this->tile_data).texcoords[0].y = 0.0;
      (this->tile_data).texcoords[1].x = 0.0;
      (this->tile_data).texcoords[1].y = 0.0;
    }
  }
  return;
}

Assistant:

void DecoratorTiled::Tile::CalculateDimensions(Texture texture) const
{
	if (!tile_data_calculated)
	{
		tile_data_calculated = true;
		tile_data = {};

		const Vector2f texture_dimensions(texture.GetDimensions());
		if (texture_dimensions.x == 0 || texture_dimensions.y == 0)
		{
			tile_data.size = Vector2f(0, 0);
			tile_data.texcoords[0] = Vector2f(0, 0);
			tile_data.texcoords[1] = Vector2f(0, 0);
		}
		else
		{
			// Need to scale the coordinates to normalized units and 'size' to absolute size (pixels)
			if (size.x == 0 && size.y == 0 && position.x == 0 && position.y == 0)
				tile_data.size = texture_dimensions;
			else
				tile_data.size = size;

			const Vector2f size_relative = tile_data.size / texture_dimensions;

			tile_data.size = Vector2f(Math::Absolute(tile_data.size.x), Math::Absolute(tile_data.size.y));

			tile_data.texcoords[0] = position / texture_dimensions;
			tile_data.texcoords[1] = size_relative + tile_data.texcoords[0];
		}
	}
}